

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_device_memory_device.cpp
# Opt level: O2

void renderFrameStandard(int *pixels,uint width,uint height,float time,ISPCCamera *camera)

{
  char cVar1;
  task *ptVar2;
  runtime_error *this;
  uint uVar3;
  auto_partitioner local_111;
  small_object_pool *local_110;
  int numTilesY;
  int numTilesX;
  float time_local;
  uint height_local;
  uint width_local;
  int **local_f0;
  uint *local_e8;
  uint *local_e0;
  float *local_d8;
  ISPCCamera *local_d0;
  int *local_c8;
  int *local_c0;
  int *pixels_local;
  undefined8 local_b0;
  undefined4 local_a8;
  wait_context local_a0;
  task_group_context context;
  
  local_f0 = &pixels_local;
  local_e8 = &width_local;
  local_e0 = &height_local;
  local_d8 = &time_local;
  numTilesX = width + 7 >> 3;
  local_c8 = &numTilesX;
  numTilesY = height + 7 >> 3;
  local_c0 = &numTilesY;
  uVar3 = numTilesY * numTilesX;
  time_local = time;
  height_local = height;
  width_local = width;
  local_d0 = camera;
  pixels_local = pixels;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  if (uVar3 != 0) {
    local_110 = (small_object_pool *)0x0;
    ptVar2 = (task *)tbb::detail::r1::allocate(&local_110,0x80);
    ptVar2->m_reserved[3] = 0;
    ptVar2->m_reserved[4] = 0;
    ptVar2->m_reserved[1] = 0;
    ptVar2->m_reserved[2] = 0;
    ptVar2->m_reserved[5] = 0;
    (ptVar2->super_task_traits).m_version_and_traits = 0;
    ptVar2->m_reserved[0] = 0;
    ptVar2->_vptr_task = (_func_int **)&PTR__task_002a6d80;
    ptVar2[1]._vptr_task = (_func_int **)(ulong)uVar3;
    ptVar2[1].super_task_traits.m_version_and_traits = 0;
    ptVar2[1].m_reserved[0] = 1;
    ptVar2[1].m_reserved[1] = (uint64_t)&local_f0;
    tbb::detail::d1::auto_partition_type::auto_partition_type
              ((auto_partition_type *)(ptVar2[1].m_reserved + 3),&local_111);
    ptVar2[1].m_reserved[5] = (uint64_t)local_110;
    local_b0 = 0;
    local_a8 = 1;
    local_a0.m_version_and_traits = 1;
    local_a0.m_ref_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1;
    ptVar2[1].m_reserved[2] = (uint64_t)&local_b0;
    tbb::detail::r1::execute_and_wait(ptVar2,&context,&local_a0,&context);
  }
  cVar1 = tbb::detail::r1::is_group_execution_cancelled(&context);
  if (cVar1 == '\0') {
    tbb::detail::d1::task_group_context::~task_group_context(&context);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"task cancelled");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void renderFrameStandard (int* pixels,
                          const unsigned int width,
                          const unsigned int height,
                          const float time,
                          const ISPCCamera& camera)
{
#if defined(EMBREE_SYCL_TUTORIAL) && !defined(EMBREE_SYCL_RT_SIMULATION) && !defined(EMBREE_SYCL_RT_SIMULATION)
  TutorialData ldata = data;
  sycl::event event = global_gpu_queue->submit([=](sycl::handler& cgh){
    const sycl::nd_range<2> nd_range = make_nd_range(height,width);
    cgh.parallel_for(nd_range,[=](sycl::nd_item<2> item) {
      const unsigned int x = item.get_global_id(1); if (x >= width ) return;
      const unsigned int y = item.get_global_id(0); if (y >= height) return;
      RayStats stats;
      renderPixelStandard(ldata,x,y,pixels,width,height,time,camera,stats);
    });
  });
  global_gpu_queue->wait_and_throw();

  const auto t0 = event.template get_profiling_info<sycl::info::event_profiling::command_start>();
  const auto t1 = event.template get_profiling_info<sycl::info::event_profiling::command_end>();
  const double dt = (t1-t0)*1E-9;
  ((ISPCCamera*)&camera)->render_time = dt;
#else
  const int numTilesX = (width +TILE_SIZE_X-1)/TILE_SIZE_X;
  const int numTilesY = (height+TILE_SIZE_Y-1)/TILE_SIZE_Y;
  parallel_for(size_t(0),size_t(numTilesX*numTilesY),[&](const range<size_t>& range) {
    const int threadIndex = (int)TaskScheduler::threadIndex();
    for (size_t i=range.begin(); i<range.end(); i++)
      renderTileTask((int)i,threadIndex,pixels,width,height,time,camera,numTilesX,numTilesY);
  }); 
#endif
}